

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O2

void NJD_load_from_fp(NJD *njd,FILE *fp)

{
  int iVar1;
  NJDNode *node;
  char chain_flag [1024];
  char chain_rule [1024];
  char mora_size [1024];
  char acc [1024];
  char pron [1024];
  char read [1024];
  char orig [1024];
  char cform [1024];
  char ctype [1024];
  char pos_group3 [1024];
  char pos_group2 [1024];
  char pos_group1 [1024];
  char pos [1024];
  char string [1024];
  
  if (fp == (FILE *)0x0) {
    fwrite("WARNING: NJD_load_from_fp() in njd.c: File pointer should not be null.",0x46,1,_stderr);
    return;
  }
  while( true ) {
    get_token_from_fp(fp,string,',');
    iVar1 = get_token_from_fp(fp,pos,',');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,pos_group1,',');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,pos_group2,',');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,pos_group3,',');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,ctype,',');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,cform,',');
    if (iVar1 < 1) {
      return;
    }
    get_token_from_fp(fp,orig,',');
    get_token_from_fp(fp,read,',');
    get_token_from_fp(fp,pron,',');
    iVar1 = get_token_from_fp(fp,acc,'/');
    if (iVar1 < 1) {
      return;
    }
    iVar1 = get_token_from_fp(fp,mora_size,',');
    if (iVar1 < 1) break;
    get_token_from_fp(fp,chain_rule,',');
    iVar1 = get_token_from_fp(fp,chain_flag,',');
    if (iVar1 < 1) {
      return;
    }
    node = (NJDNode *)calloc(1,0x78);
    NJDNode_initialize(node);
    NJDNode_set_string(node,string);
    NJDNode_set_pos(node,pos);
    NJDNode_set_pos_group1(node,pos_group1);
    NJDNode_set_pos_group2(node,pos_group2);
    NJDNode_set_pos_group3(node,pos_group3);
    NJDNode_set_ctype(node,ctype);
    NJDNode_set_cform(node,cform);
    NJDNode_set_orig(node,orig);
    NJDNode_set_read(node,read);
    NJDNode_set_pron(node,pron);
    iVar1 = atoi(acc);
    NJDNode_set_acc(node,iVar1);
    iVar1 = atoi(mora_size);
    NJDNode_set_mora_size(node,iVar1);
    NJDNode_set_chain_rule(node,chain_rule);
    iVar1 = atoi(chain_flag);
    NJDNode_set_chain_flag(node,iVar1);
    NJD_push_node(njd,node);
  }
  return;
}

Assistant:

void NJD_load_from_fp(NJD * njd, FILE * fp)
{
   NJDNode *node = NULL;
   char string[MAXBUFLEN];
   char pos[MAXBUFLEN];
   char pos_group1[MAXBUFLEN];
   char pos_group2[MAXBUFLEN];
   char pos_group3[MAXBUFLEN];
   char ctype[MAXBUFLEN];
   char cform[MAXBUFLEN];
   char orig[MAXBUFLEN];
   char read[MAXBUFLEN];
   char pron[MAXBUFLEN];
   char acc[MAXBUFLEN];
   char mora_size[MAXBUFLEN];
   char chain_rule[MAXBUFLEN];
   char chain_flag[MAXBUFLEN];

   if (fp == NULL) {
      fprintf(stderr, "WARNING: NJD_load_from_fp() in njd.c: File pointer should not be null.");
      return;
   }

   while (1) {
      get_token_from_fp(fp, string, ',');
      if (get_token_from_fp(fp, pos, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group1, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group2, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group3, ',') <= 0)
         break;
      if (get_token_from_fp(fp, ctype, ',') <= 0)
         break;
      if (get_token_from_fp(fp, cform, ',') <= 0)
         break;
      get_token_from_fp(fp, orig, ',');
      get_token_from_fp(fp, read, ',');
      get_token_from_fp(fp, pron, ',');
      if (get_token_from_fp(fp, acc, '/') <= 0)
         break;
      if (get_token_from_fp(fp, mora_size, ',') <= 0)
         break;
      get_token_from_fp(fp, chain_rule, ',');
      if (get_token_from_fp(fp, chain_flag, ',') <= 0)
         break;
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_set_string(node, string);
      NJDNode_set_pos(node, pos);
      NJDNode_set_pos_group1(node, pos_group1);
      NJDNode_set_pos_group2(node, pos_group2);
      NJDNode_set_pos_group3(node, pos_group3);
      NJDNode_set_ctype(node, ctype);
      NJDNode_set_cform(node, cform);
      NJDNode_set_orig(node, orig);
      NJDNode_set_read(node, read);
      NJDNode_set_pron(node, pron);
      NJDNode_set_acc(node, atoi(acc));
      NJDNode_set_mora_size(node, atoi(mora_size));
      NJDNode_set_chain_rule(node, chain_rule);
      NJDNode_set_chain_flag(node, atoi(chain_flag));
      NJD_push_node(njd, node);
   }
}